

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

void __thiscall Disk::Disk(Disk *this,Format *fmt_)

{
  int iVar1;
  int iVar2;
  uint8_t uVar3;
  bool bVar4;
  undefined2 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Encoding EVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  FdcType FVar16;
  DataRate DVar17;
  Data local_48;
  allocator<char> local_19;
  Format *local_18;
  Format *fmt__local;
  Disk *this_local;
  
  this->_vptr_Disk = (_func_int **)&PTR__Disk_003020c8;
  iVar14 = fmt_->cyls;
  iVar15 = fmt_->heads;
  FVar16 = fmt_->fdc;
  DVar17 = fmt_->datarate;
  EVar10 = fmt_->encoding;
  iVar11 = fmt_->sectors;
  iVar12 = fmt_->size;
  iVar13 = fmt_->base;
  iVar6 = fmt_->offset;
  iVar7 = fmt_->interleave;
  iVar8 = fmt_->skew;
  iVar9 = fmt_->head0;
  iVar1 = fmt_->head1;
  iVar2 = fmt_->gap3;
  uVar3 = fmt_->fill;
  bVar4 = fmt_->cyls_first;
  uVar5 = *(undefined2 *)&fmt_->field_0x3a;
  (this->fmt).head0 = fmt_->head0;
  (this->fmt).head1 = iVar1;
  (this->fmt).gap3 = iVar2;
  (this->fmt).fill = uVar3;
  (this->fmt).cyls_first = bVar4;
  *(undefined2 *)&(this->fmt).field_0x3a = uVar5;
  (this->fmt).offset = iVar6;
  (this->fmt).interleave = iVar7;
  (this->fmt).skew = iVar8;
  (this->fmt).head0 = iVar9;
  (this->fmt).encoding = EVar10;
  (this->fmt).sectors = iVar11;
  (this->fmt).size = iVar12;
  (this->fmt).base = iVar13;
  (this->fmt).cyls = iVar14;
  (this->fmt).heads = iVar15;
  (this->fmt).fdc = FVar16;
  (this->fmt).datarate = DVar17;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->metadata)._M_t._M_impl = 0;
  *(undefined8 *)&(this->metadata)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  local_18 = fmt_;
  fmt__local = (Format *)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->metadata);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->strType,"<unknown>",&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->m_trackdata)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_trackdata)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  ::map(&this->m_trackdata);
  *(undefined8 *)((long)&(this->m_trackdata_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_trackdata_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_trackdata_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::mutex::mutex(&this->m_trackdata_mutex);
  local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Data::Data(&local_48);
  format(this,&this->fmt,&local_48,false);
  Data::~Data(&local_48);
  return;
}

Assistant:

Disk::Disk(Format& fmt_)
    : fmt(fmt_)
{
    format(fmt);
}